

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O1

int Wln_NtkIsAcyclic(Wln_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  FILE *pFVar11;
  
  iVar2 = p->nTravIds;
  p->nTravIds = iVar2 + 1;
  if (iVar2 == 0) {
    uVar8 = (p->vTypes).nCap;
    if ((p->vTravIds).nCap < (int)uVar8) {
      piVar3 = (p->vTravIds).pArray;
      if (piVar3 == (int *)0x0) {
        piVar3 = (int *)malloc((long)(int)uVar8 << 2);
      }
      else {
        piVar3 = (int *)realloc(piVar3,(long)(int)uVar8 << 2);
      }
      (p->vTravIds).pArray = piVar3;
      if (piVar3 == (int *)0x0) goto LAB_00384c79;
      (p->vTravIds).nCap = uVar8;
    }
    if (0 < (int)uVar8) {
      memset((p->vTravIds).pArray,0,(ulong)uVar8 * 4);
    }
    (p->vTravIds).nSize = uVar8;
  }
  iVar2 = p->nTravIds;
  p->nTravIds = iVar2 + 1;
  if (iVar2 == 0) {
    uVar8 = (p->vTypes).nCap;
    if ((p->vTravIds).nCap < (int)uVar8) {
      piVar3 = (p->vTravIds).pArray;
      if (piVar3 == (int *)0x0) {
        piVar3 = (int *)malloc((long)(int)uVar8 << 2);
      }
      else {
        piVar3 = (int *)realloc(piVar3,(long)(int)uVar8 << 2);
      }
      (p->vTravIds).pArray = piVar3;
      if (piVar3 == (int *)0x0) {
LAB_00384c79:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vTravIds).nCap = uVar8;
    }
    if (0 < (int)uVar8) {
      memset((p->vTravIds).pArray,0,(ulong)uVar8 * 4);
    }
    (p->vTravIds).nSize = uVar8;
  }
  if (0 < (p->vCos).nSize) {
    lVar9 = 0;
    do {
      uVar8 = (p->vCos).pArray[lVar9];
      iVar2 = Wln_NtkIsAcyclic_rec(p,uVar8);
      pFVar11 = _stdout;
      if (iVar2 == 0) {
        pcVar4 = Wln_ObjName(p,uVar8);
        pcVar5 = "Primary output %16s (ID %6d)\n";
        goto LAB_00384c00;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vCos).nSize);
  }
  if (0 < (p->vFfs).nSize) {
    lVar9 = 0;
    do {
      uVar8 = (p->vFfs).pArray[lVar9];
      iVar2 = Wln_NtkIsAcyclic_rec(p,uVar8);
      pFVar11 = _stdout;
      if (iVar2 == 0) {
        pcVar4 = Wln_ObjName(p,uVar8);
        pcVar5 = "Flip-flop %16s (ID %6d)\n";
LAB_00384c00:
        fprintf(pFVar11,pcVar5,pcVar4,(ulong)uVar8);
        return 0;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (p->vFfs).nSize);
  }
  iVar2 = (p->vTypes).nSize;
  uVar8 = 0;
  if (1 < (long)iVar2) {
    iVar1 = (p->vTravIds).nSize;
    iVar6 = 1;
    if (1 < iVar1) {
      iVar6 = iVar1;
    }
    uVar8 = 0;
    lVar9 = 1;
    do {
      if (iVar6 - 1U <= iVar2 - 2U) goto LAB_00384c5a;
      uVar7 = 0;
      if ((p->vTravIds).pArray[lVar9] != p->nTravIds + -1) {
        uVar7 = (uint)((p->vTypes).pArray[lVar9] != 3);
      }
      uVar8 = uVar8 + uVar7;
      lVar9 = lVar9 + 1;
    } while (iVar2 != lVar9);
  }
  if (uVar8 != 0) {
    Wln_NtkCreateRefs(p);
    uVar7 = (p->vTypes).nSize;
    printf("The network has %d objects and %d (%6.2f %%) of them are not connected to the outputs.\n"
           ,((double)(int)uVar8 * 100.0) / (double)(int)uVar7,(ulong)uVar7,(ulong)uVar8);
    iVar2 = (p->vTypes).nSize;
    uVar8 = 0;
    if (1 < (long)iVar2) {
      iVar1 = (p->vRefs).nSize;
      iVar6 = 1;
      if (1 < iVar1) {
        iVar6 = iVar1;
      }
      uVar8 = 0;
      lVar9 = 1;
      do {
        if (iVar6 - 1U <= iVar2 - 2U) goto LAB_00384c5a;
        if (((p->vRefs).pArray[lVar9] == 0) && (iVar1 = (p->vTypes).pArray[lVar9], 1 < iVar1 - 3U))
        {
          uVar8 = uVar8 + (iVar1 != 0x59);
        }
        lVar9 = lVar9 + 1;
      } while (iVar2 != lVar9);
    }
    if (uVar8 != 0) {
      iVar2 = 0;
      printf("These unconnected objects feed into %d sink objects without fanout:\n",(ulong)uVar8);
      if (1 < (p->vTypes).nSize) {
        uVar10 = 1;
        iVar2 = 0;
        do {
          pFVar11 = _stdout;
          if ((long)(p->vRefs).nSize <= (long)uVar10) goto LAB_00384c5a;
          if ((((p->vRefs).pArray[uVar10] == 0) &&
              (iVar1 = (p->vTypes).pArray[uVar10], 1 < iVar1 - 3U)) && (iVar1 != 0x59)) {
            pcVar4 = Wln_ObjName(p,(int)uVar10);
            if (((long)(p->vTypes).nSize <= (long)uVar10) ||
               (pcVar5 = Abc_OperName((p->vTypes).pArray[uVar10]),
               (long)(p->vTypes).nSize <= (long)uVar10)) goto LAB_00384c5a;
            fprintf(pFVar11,"Node %16s (ID %6d) of type %5s (type ID %2d)\n",pcVar4,
                    uVar10 & 0xffffffff,pcVar5,(ulong)(uint)(p->vTypes).pArray[uVar10]);
            iVar2 = iVar2 + 1;
            if (iVar2 == 5) {
              iVar2 = 5;
              break;
            }
          }
          uVar10 = uVar10 + 1;
        } while ((long)uVar10 < (long)(p->vTypes).nSize);
      }
      if (iVar2 < (int)uVar8) {
        puts("...");
      }
    }
    if (1 < (p->vTypes).nSize) {
      lVar9 = 1;
      do {
        if ((p->vTravIds).nSize <= lVar9) {
LAB_00384c5a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (((p->vTravIds).pArray[lVar9] != p->nTravIds + -1) && ((p->vTypes).pArray[lVar9] != 3)) {
          iVar2 = Wln_NtkIsAcyclic_rec(p,(int)lVar9);
          pFVar11 = _stdout;
          if (iVar2 == 0) {
            pcVar4 = Wln_ObjName(p,(int)lVar9);
            fprintf(pFVar11,"Unconnected object %s\n",pcVar4);
            return 0;
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (p->vTypes).nSize);
    }
  }
  return 1;
}

Assistant:

int Wln_NtkIsAcyclic( Wln_Ntk_t * p )
{
    int fAcyclic, i, iObj, nUnvisited = 0 ;
    // set the traversal ID for this DFS ordering
    Wln_NtkIncrementTravId( p );   
    Wln_NtkIncrementTravId( p );   
    // iObj->TravId == pNet->nTravIds      means "iObj is on the path"
    // iObj->TravId == pNet->nTravIds - 1  means "iObj is visited but is not on the path"
    // iObj->TravId <  pNet->nTravIds - 1  means "iObj is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Wln_NtkForEachCo( p, iObj, i )
    {
        // traverse the output logic cone
        if ( (fAcyclic = Wln_NtkIsAcyclic_rec(p, iObj)) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, "Primary output %16s (ID %6d)\n", Wln_ObjName(p, iObj), iObj );
        goto finish;
    }
    Wln_NtkForEachFf( p, iObj, i )
    {
        // traverse the output logic cone
        if ( (fAcyclic = Wln_NtkIsAcyclic_rec(p, iObj)) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, "Flip-flop %16s (ID %6d)\n", Wln_ObjName(p, iObj), iObj );
        goto finish;
    }
    Wln_NtkForEachObj( p, iObj )
        nUnvisited += !Wln_ObjIsTravIdPrevious(p, iObj) && !Wln_ObjIsCi(p, iObj);
    if ( nUnvisited )
    {
        int nSinks = 0;
        Wln_NtkCreateRefs(p);
        printf( "The network has %d objects and %d (%6.2f %%) of them are not connected to the outputs.\n", 
            Wln_NtkObjNum(p), nUnvisited, 100.0*nUnvisited/Wln_NtkObjNum(p) );
        Wln_NtkForEachObj( p, iObj )
            if ( !Wln_ObjRefs(p, iObj) && !Wln_ObjIsCi(p, iObj) && !Wln_ObjIsCo(p, iObj) && !Wln_ObjIsFf(p, iObj) )
                nSinks++;
        if ( nSinks )
        {
            int nPrinted = 0;
            printf( "These unconnected objects feed into %d sink objects without fanout:\n", nSinks );
            Wln_NtkForEachObj( p, iObj )
                if ( !Wln_ObjRefs(p, iObj) && !Wln_ObjIsCi(p, iObj) && !Wln_ObjIsCo(p, iObj) && !Wln_ObjIsFf(p, iObj) )
                {
                    fprintf( stdout, "Node %16s (ID %6d) of type %5s (type ID %2d)\n", 
                        Wln_ObjName(p, iObj), iObj, Abc_OperName(Wln_ObjType(p, iObj)), Wln_ObjType(p, iObj) );
                    if ( ++nPrinted == 5 )
                        break;
                }
            if ( nPrinted < nSinks )
                printf( "...\n" );
        }
        Wln_NtkForEachObj( p, iObj )
            if ( /*!Wln_ObjRefs(p, iObj) &&*/ !Wln_ObjIsTravIdPrevious(p, iObj) && !Wln_ObjIsCi(p, iObj) )
            {
                // traverse the output logic cone
                if ( (fAcyclic = Wln_NtkIsAcyclic_rec(p, iObj)) )
                    continue;
                // stop as soon as the first loop is detected
                fprintf( stdout, "Unconnected object %s\n", Wln_ObjName(p, iObj) );
                goto finish;
            }
    }
finish:
    return fAcyclic;
}